

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTimeValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DateTimeValidator::serialize(DateTimeValidator *this,XSerializeEngine *serEng)

{
  if (serEng->fStoreLoad == 0) {
    XSerializeEngine::operator<<(serEng,3);
  }
  AbstractNumericFacetValidator::serialize(&this->super_AbstractNumericFacetValidator,serEng);
  return;
}

Assistant:

void DateTimeValidator::serialize(XSerializeEngine& serEng)
{
    /***
     *
     * Note: All its derivatives share the same number type, that is
     *       XMLNumber::DateTime, so this class would write it.
     ***/

    if (serEng.isStoring())
    {
        serEng<<(int) XMLNumber::DateTime;
    }

    AbstractNumericFacetValidator::serialize(serEng);

    //dateTime can be instantiated during checkContent(), so don't serialize it.
}